

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjPlaneWidth(int componentID,int width,int subsamp)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  if (((0 < width && (uint)subsamp < 6) && (-1 < componentID)) &&
     ((uint)componentID < (uint)(subsamp != 3) * 2 + 1)) {
    iVar1 = tjMCUWidth[(uint)subsamp];
    iVar2 = iVar1 + 7;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    uVar3 = -(iVar2 >> 3) & (width + (iVar2 >> 3)) - 1U;
    if (componentID != 0) {
      uVar3 = (int)(uVar3 << 3) / iVar1;
    }
    return uVar3;
  }
  builtin_strncpy((char *)(in_FS_OFFSET + -0xc0),"Invalid ",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xb8),"argument",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjPlaneW",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -200),"idth(): ",8);
  *(undefined1 *)(in_FS_OFFSET + -0xb0) = 0;
  return -1;
}

Assistant:

DLLEXPORT int tjPlaneWidth(int componentID, int width, int subsamp)
{
  int pw, nc, retval = 0;

  if (width < 1 || subsamp < 0 || subsamp >= TJ_NUMSAMP)
    THROWG("tjPlaneWidth(): Invalid argument");
  nc = (subsamp == TJSAMP_GRAY ? 1 : 3);
  if (componentID < 0 || componentID >= nc)
    THROWG("tjPlaneWidth(): Invalid argument");

  pw = PAD(width, tjMCUWidth[subsamp] / 8);
  if (componentID == 0)
    retval = pw;
  else
    retval = pw * 8 / tjMCUWidth[subsamp];

bailout:
  return retval;
}